

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  int extraout_EAX;
  long *plVar4;
  TextureWrapCase *pTVar5;
  long *plVar6;
  pointer pbVar7;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  char *__end;
  string name;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  TestNode *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  anon_struct_16_2_3f8b7511 *local_38;
  
  lVar11 = 0;
  do {
    local_38 = init::wrapModes + lVar11;
    dVar1 = init::wrapModes[lVar11].mode;
    lVar9 = 0;
    local_58 = lVar11;
    do {
      lVar11 = 0;
      local_50 = lVar9;
      do {
        local_e0 = (TestNode *)(init::filteringModes + lVar11);
        lVar10 = 0;
        local_48 = lVar11;
        do {
          lVar11 = 0;
          local_40 = lVar10;
          do {
            if ((lVar9 == 0 && dVar1 == 0x812f || (lVar11 == 0 || lVar9 == 2 && dVar1 == 0x2901)) &&
               ((lVar9 == 0 && dVar1 == 0x812f ||
                (((init::sizes[lVar10].width & init::sizes[lVar10].width - 1U) == 0 &&
                 ((init::sizes[lVar10].height & init::sizes[lVar10].height - 1U) == 0)))))) {
              local_78[0] = local_68;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1b32ab9);
              plVar4 = (long *)std::__cxx11::string::append((char *)local_78);
              local_98 = &local_88;
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_88 = *plVar6;
                lStack_80 = plVar4[3];
              }
              else {
                local_88 = *plVar6;
                local_98 = (long *)*plVar4;
              }
              local_90 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
              potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&potFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar7 = (pointer)(plVar4 + 2);
              if ((pointer)*plVar4 == pbVar7) {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar7->_M_dataplus)._M_p;
              }
              else {
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar7->_M_dataplus)._M_p;
                potFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar4;
              }
              potFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar4[1];
              *plVar4 = (long)pbVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&potFilenames);
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_f0 = *plVar6;
                lStack_e8 = plVar4[3];
                local_100 = &local_f0;
              }
              else {
                local_f0 = *plVar6;
                local_100 = (long *)*plVar4;
              }
              local_f8 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_130 = *plVar6;
                lStack_128 = plVar4[3];
                local_140 = &local_130;
              }
              else {
                local_130 = *plVar6;
                local_140 = (long *)*plVar4;
              }
              local_138 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
              local_120 = &local_110;
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_110 = *plVar6;
                lStack_108 = plVar4[3];
              }
              else {
                local_110 = *plVar6;
                local_120 = (long *)*plVar4;
              }
              local_118 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&npotFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar7 = (pointer)(plVar4 + 2);
              if ((pointer)*plVar4 == pbVar7) {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar7->_M_dataplus)._M_p;
              }
              else {
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar7->_M_dataplus)._M_p;
                npotFilenames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar4;
              }
              npotFilenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar4[1];
              *plVar4 = (long)pbVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
              local_1a8 = &local_198;
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_198 = *plVar6;
                lStack_190 = plVar4[3];
              }
              else {
                local_198 = *plVar6;
                local_1a8 = (long *)*plVar4;
              }
              local_1a0 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
              plVar6 = plVar4 + 2;
              if ((long *)*plVar4 == plVar6) {
                local_178 = *plVar6;
                lStack_170 = plVar4[3];
                local_188 = &local_178;
              }
              else {
                local_178 = *plVar6;
                local_188 = (long *)*plVar4;
              }
              local_180 = plVar4[1];
              *plVar4 = (long)plVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar8 = (size_type *)(plVar4 + 2);
              if ((size_type *)*plVar4 == psVar8) {
                name.field_2._M_allocated_capacity = *psVar8;
                name.field_2._8_8_ = plVar4[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar8;
                name._M_dataplus._M_p = (pointer)*plVar4;
              }
              name._M_string_length = plVar4[1];
              *plVar4 = (long)psVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if (local_188 != &local_178) {
                operator_delete(local_188,local_178 + 1);
              }
              if (local_1a8 != &local_198) {
                operator_delete(local_1a8,local_198 + 1);
              }
              if (npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&npotFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(npotFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((npotFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (local_120 != &local_110) {
                operator_delete(local_120,local_110 + 1);
              }
              if (local_140 != &local_130) {
                operator_delete(local_140,local_130 + 1);
              }
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              if (potFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&potFilenames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(potFilenames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((potFilenames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if (local_98 != &local_88) {
                operator_delete(local_98,local_88 + 1);
              }
              if (local_78[0] != local_68) {
                operator_delete(local_78[0],local_68[0] + 1);
              }
              pTVar5 = (TextureWrapCase *)operator_new(0x118);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              TextureWrapCase::TextureWrapCase
                        (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                         name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                         *(deUint32 *)((long)&init::formats[0].format + lVar11),
                         *(deUint32 *)((long)&init::formats[0].dataType + lVar11),dVar1,
                         init::wrapModes[lVar9].mode,*(deUint32 *)&local_e0->m_testCtx,
                         *(deUint32 *)&local_e0->m_testCtx,init::sizes[lVar10].width,
                         init::sizes[lVar10].height);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x40);
          lVar10 = local_40 + 1;
        } while (local_40 == 0);
        lVar11 = local_48 + 1;
      } while (local_48 == 0);
      lVar9 = local_50 + 1;
    } while (lVar9 != 3);
    lVar11 = local_58 + 1;
  } while (lVar11 != 3);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_mip_0.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
             &name);
  local_e0 = (TestNode *)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = local_e0;
  lVar11 = 0;
  do {
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        local_100 = &local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,0x1b32ab9,0x1b32ab9);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_140 = &local_130;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_130 = *plVar6;
          lStack_128 = plVar4[3];
        }
        else {
          local_130 = *plVar6;
          local_140 = (long *)*plVar4;
        }
        local_138 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_120 = &local_110;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_110 = *plVar6;
          lStack_108 = plVar4[3];
        }
        else {
          local_110 = *plVar6;
          local_120 = (long *)*plVar4;
        }
        local_118 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar7 = (pointer)(plVar4 + 2);
        if ((pointer)*plVar4 == pbVar7) {
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar7->_M_dataplus)._M_p;
        }
        else {
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar7->_M_dataplus)._M_p;
          npotFilenames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar4;
        }
        npotFilenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar4[1];
        *plVar4 = (long)pbVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&npotFilenames);
        local_1a8 = &local_198;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_198 = *plVar6;
          lStack_190 = plVar4[3];
        }
        else {
          local_198 = *plVar6;
          local_1a8 = (long *)*plVar4;
        }
        local_1a0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_188 = &local_178;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_178 = *plVar6;
          lStack_170 = plVar4[3];
        }
        else {
          local_178 = *plVar6;
          local_188 = (long *)*plVar4;
        }
        local_180 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar8) {
          name.field_2._M_allocated_capacity = *psVar8;
          name.field_2._8_8_ = plVar4[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar8;
          name._M_dataplus._M_p = (pointer)*plVar4;
        }
        name._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (npotFilenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(npotFilenames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((npotFilenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        pTVar5 = (TextureWrapCase *)operator_new(0x118);
        dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar10);
        TextureWrapCase::TextureWrapCase
                  (pTVar5,pTVar3->m_testCtx,(RenderContext *)pTVar3[1]._vptr_TestNode[1],
                   (ContextInfo *)pTVar3[1]._vptr_TestNode[2],name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar11].mode,
                   init::wrapModes[lVar9].mode,dVar1,dVar1,&potFilenames);
        tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 == 0x10);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&name,"data/etc1/photo_helsinki_113x89.pkm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
             &name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = local_e0;
  lVar11 = 0;
  do {
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"clamp_clamp_","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_188 = &local_178;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_178 = *plVar6;
      lStack_170 = plVar4[3];
    }
    else {
      local_178 = *plVar6;
      local_188 = (long *)*plVar4;
    }
    local_180 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      name.field_2._M_allocated_capacity = *psVar8;
      name.field_2._8_8_ = plVar4[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar8;
      name._M_dataplus._M_p = (pointer)*plVar4;
    }
    name._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    pTVar5 = (TextureWrapCase *)operator_new(0x118);
    dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar11);
    TextureWrapCase::TextureWrapCase
              (pTVar5,pTVar3->m_testCtx,(RenderContext *)pTVar3[1]._vptr_TestNode[1],
               (ContextInfo *)pTVar3[1]._vptr_TestNode[2],name._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,0x812f,0x812f,dVar1,dVar1,&npotFilenames);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 == 0x10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  return extraout_EAX;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes[] =
	{
		{ "pot",		64, 128 },
		{ "npot",		63, 112 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
	FOR_EACH(size,		sizes,
	FOR_EACH(format,	formats,
		{
			bool is_clamp_clamp		= (wrapModes[wrapS].mode == GL_CLAMP_TO_EDGE	&& wrapModes[wrapT].mode == GL_CLAMP_TO_EDGE);
			bool is_repeat_mirror	= (wrapModes[wrapS].mode == GL_REPEAT			&& wrapModes[wrapT].mode == GL_MIRRORED_REPEAT);

			if (!is_clamp_clamp && !is_repeat_mirror && format != 0)
				continue; // Use other format varants with clamp_clamp & repeat_mirror pair only.

			if (!is_clamp_clamp && (!deIsPowerOfTwo32(sizes[size].width) || !deIsPowerOfTwo32(sizes[size].height)))
				continue; // Not supported as described in Spec section 3.8.2.

			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + sizes[size].name + "_" + formats[format].name;
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 formats[format].format, formats[format].dataType,
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 sizes[size].width, sizes[size].height));

		})))));

	// Power-of-two ETC1 texture
	std::vector<std::string> potFilenames;
	potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
		{
			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot_etc1";
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 potFilenames));

		})));

	std::vector<std::string> npotFilenames;
	npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

	// NPOT ETC1 texture
	for (int filter = 0; filter < DE_LENGTH_OF_ARRAY(filteringModes); filter++)
	{
		string name = string("clamp_clamp_") + filteringModes[filter].name + "_npot_etc1";
		addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
									 GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE,
									 filteringModes[filter].mode, filteringModes[filter].mode,
									 npotFilenames));
	}
}